

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.c
# Opt level: O3

int mbedtls_chacha20_update(mbedtls_chacha20_context *ctx,size_t size,uchar *input,uchar *output)

{
  ulong uVar1;
  size_t sVar2;
  uchar *puVar3;
  size_t sVar4;
  uchar *puVar5;
  size_t sVar6;
  
  if (size != 0) {
    uVar1 = ctx->keystream_bytes_used;
    puVar5 = output + 7;
    puVar3 = input + 7;
    sVar4 = 0;
    while (uVar1 < 0x40) {
      puVar5[-7] = ctx->keystream8[uVar1] ^ puVar3[-7];
      uVar1 = ctx->keystream_bytes_used + 1;
      ctx->keystream_bytes_used = uVar1;
      sVar4 = sVar4 + 1;
      puVar5 = puVar5 + 1;
      puVar3 = puVar3 + 1;
      if (size == sVar4) {
        return 0;
      }
    }
    sVar6 = size - sVar4;
    if (0x3f < sVar6) {
      do {
        chacha20_block(ctx->state,ctx->keystream8);
        ctx->state[0xc] = ctx->state[0xc] + 1;
        uVar1 = 0xfffffffffffffff8;
        do {
          puVar5[uVar1 + 1] = ctx->keystream8[uVar1 + 8] ^ puVar3[uVar1 + 1];
          puVar5[uVar1 + 2] = ctx->keystream8[uVar1 + 9] ^ puVar3[uVar1 + 2];
          puVar5[uVar1 + 3] = ctx->keystream8[uVar1 + 10] ^ puVar3[uVar1 + 3];
          puVar5[uVar1 + 4] = ctx->keystream8[uVar1 + 0xb] ^ puVar3[uVar1 + 4];
          puVar5[uVar1 + 5] = ctx->keystream8[uVar1 + 0xc] ^ puVar3[uVar1 + 5];
          puVar5[uVar1 + 6] = ctx->keystream8[uVar1 + 0xd] ^ puVar3[uVar1 + 6];
          puVar5[uVar1 + 7] = ctx->keystream8[uVar1 + 0xe] ^ puVar3[uVar1 + 7];
          puVar5[uVar1 + 8] = ctx->keystream8[uVar1 + 0xf] ^ puVar3[uVar1 + 8];
          uVar1 = uVar1 + 8;
        } while (uVar1 < 0x38);
        sVar4 = sVar4 + 0x40;
        sVar6 = sVar6 - 0x40;
        puVar5 = puVar5 + 0x40;
        puVar3 = puVar3 + 0x40;
      } while (0x3f < sVar6);
      if (sVar6 == 0) {
        return 0;
      }
    }
    chacha20_block(ctx->state,ctx->keystream8);
    ctx->state[0xc] = ctx->state[0xc] + 1;
    sVar2 = 0;
    do {
      output[sVar2 + sVar4] = ctx->keystream8[sVar2] ^ input[sVar2 + sVar4];
      sVar2 = sVar2 + 1;
    } while (sVar6 != sVar2);
    ctx->keystream_bytes_used = sVar6;
  }
  return 0;
}

Assistant:

int mbedtls_chacha20_update( mbedtls_chacha20_context *ctx,
                              size_t size,
                              const unsigned char *input,
                              unsigned char *output )
{
    size_t offset = 0U;
    size_t i;

    CHACHA20_VALIDATE_RET( ctx != NULL );
    CHACHA20_VALIDATE_RET( size == 0 || input  != NULL );
    CHACHA20_VALIDATE_RET( size == 0 || output != NULL );

    /* Use leftover keystream bytes, if available */
    while( size > 0U && ctx->keystream_bytes_used < CHACHA20_BLOCK_SIZE_BYTES )
    {
        output[offset] = input[offset]
                       ^ ctx->keystream8[ctx->keystream_bytes_used];

        ctx->keystream_bytes_used++;
        offset++;
        size--;
    }

    /* Process full blocks */
    while( size >= CHACHA20_BLOCK_SIZE_BYTES )
    {
        /* Generate new keystream block and increment counter */
        chacha20_block( ctx->state, ctx->keystream8 );
        ctx->state[CHACHA20_CTR_INDEX]++;

        for( i = 0U; i < 64U; i += 8U )
        {
            output[offset + i  ] = input[offset + i  ] ^ ctx->keystream8[i  ];
            output[offset + i+1] = input[offset + i+1] ^ ctx->keystream8[i+1];
            output[offset + i+2] = input[offset + i+2] ^ ctx->keystream8[i+2];
            output[offset + i+3] = input[offset + i+3] ^ ctx->keystream8[i+3];
            output[offset + i+4] = input[offset + i+4] ^ ctx->keystream8[i+4];
            output[offset + i+5] = input[offset + i+5] ^ ctx->keystream8[i+5];
            output[offset + i+6] = input[offset + i+6] ^ ctx->keystream8[i+6];
            output[offset + i+7] = input[offset + i+7] ^ ctx->keystream8[i+7];
        }

        offset += CHACHA20_BLOCK_SIZE_BYTES;
        size   -= CHACHA20_BLOCK_SIZE_BYTES;
    }

    /* Last (partial) block */
    if( size > 0U )
    {
        /* Generate new keystream block and increment counter */
        chacha20_block( ctx->state, ctx->keystream8 );
        ctx->state[CHACHA20_CTR_INDEX]++;

        for( i = 0U; i < size; i++)
        {
            output[offset + i] = input[offset + i] ^ ctx->keystream8[i];
        }

        ctx->keystream_bytes_used = size;

    }

    return( 0 );
}